

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::AddUnityBuild(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  pointer pUVar2;
  cmGeneratorTarget *this_00;
  pointer ppcVar3;
  pointer pUVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  iterator iVar8;
  string *psVar9;
  cmValue cVar10;
  cmValue afterInclude;
  cmValue __lhs;
  cmValue cVar11;
  cmSourceFile *pcVar12;
  long lVar13;
  pointer __x;
  pointer ppcVar14;
  UnitySource *file;
  pair<std::_Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_bool> pVar15;
  allocator<char> local_23e;
  allocator<char> local_23d;
  allocator<char> local_23c;
  allocator<char> local_23b;
  allocator<char> local_23a;
  allocator<char> local_239;
  cmLocalGenerator *local_238;
  cmGeneratorTarget *local_230;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  unitySources;
  size_t local_1e0;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> unity_files;
  string local_1a8;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  filtered_sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  value_type entry;
  cmSourceFile *sf;
  string lang;
  char *local_d0 [2];
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  index;
  string filename_base;
  string local_70;
  string local_50;
  
  local_238 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&index,"UNITY_BUILD",(allocator<char> *)&sources);
  bVar5 = cmGeneratorTarget::GetPropertyAsBool(target,(string *)&index);
  std::__cxx11::string::~string((string *)&index);
  if (bVar5) {
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,local_238->Makefile,IncludeEmptyConfig);
    p_Var1 = &index._M_t._M_impl.super__Rb_tree_header;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    local_230 = target;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; this_00 = local_230,
        local_1a8._M_dataplus._M_p <
        (pointer)((long)configs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)configs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
        local_1a8._M_dataplus._M_p = local_1a8._M_dataplus._M_p + 1) {
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      cmGeneratorTarget::GetSourceFiles
                (local_230,&sources,
                 configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)local_1a8._M_dataplus._M_p);
      ppcVar3 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppcVar14 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppcVar14 != ppcVar3;
          ppcVar14 = ppcVar14 + 1) {
        sf = *ppcVar14;
        iVar8 = std::
                _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                ::find((_Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
                        *)&index,&sf);
        if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
          std::
          vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
          ::emplace_back<cmSourceFile*&>
                    ((vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
                      *)&unitySources,&sf);
          entry.second = ((long)unitySources.
                                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)unitySources.
                                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
          entry.first = sf;
          pVar15 = std::
                   _Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                   ::_M_emplace_unique<std::pair<cmSourceFile_const*const,unsigned_long>&>
                             ((_Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                               *)&index,&entry);
          iVar8._M_node = (_Base_ptr)pVar15.first._M_node;
        }
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &unitySources.
                    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)iVar8._M_node[1]._M_parent].
                    Configs,(unsigned_long *)&local_1a8);
      }
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    }
    psVar9 = GetCurrentBinaryDirectory_abi_cxx11_(local_238);
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(psVar9->_M_dataplus)._M_p;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)psVar9->_M_string_length;
    entry.first = (cmSourceFile *)0xc;
    entry.second = (long)"**/CMakeFiles/" + 2;
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
    cmStrCat<std::__cxx11::string,char[12]>
              (&filename_base,(cmAlphaNum *)&sources,(cmAlphaNum *)&entry,psVar9,
               (char (*) [12])".dir/Unity/");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sources,"UNITY_BUILD_BATCH_SIZE",(allocator<char> *)&entry);
    cVar10 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    std::__cxx11::string::~string((string *)&sources);
    if (cVar10.Value == (string *)0x0) {
      local_1e0 = 0;
    }
    else {
      iVar7 = atoi(((cVar10.Value)->_M_dataplus)._M_p);
      local_1e0 = (size_t)iVar7;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sources,"UNITY_BUILD_CODE_BEFORE_INCLUDE",(allocator<char> *)&entry);
    cVar10 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    std::__cxx11::string::~string((string *)&sources);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sources,"UNITY_BUILD_CODE_AFTER_INCLUDE",(allocator<char> *)&entry);
    afterInclude = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    std::__cxx11::string::~string((string *)&sources);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sources,"UNITY_BUILD_MODE",(allocator<char> *)&entry);
    __lhs = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    std::__cxx11::string::~string((string *)&sources);
    local_d0[0] = "C";
    local_d0[1] = "CXX";
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lang,*(char **)((long)local_d0 + lVar13),(allocator<char> *)&sources);
      pUVar4 = unitySources.
               super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (__x = unitySources.
                 super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != pUVar4; __x = __x + 1) {
        pcVar12 = __x->Source;
        cmSourceFile::GetLanguage_abi_cxx11_((string *)&sources,pcVar12);
        _Var6 = std::operator==((string *)&sources,&lang);
        if (_Var6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&entry,"SKIP_UNITY_BUILD_INCLUSION",&local_239);
          bVar5 = cmSourceFile::GetPropertyAsBool
                            (pcVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&entry);
          if (bVar5) {
LAB_001dabec:
            std::__cxx11::string::~string((string *)&entry);
            goto LAB_001dabf4;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,"HEADER_FILE_ONLY",&local_23a);
          bVar5 = cmSourceFile::GetPropertyAsBool(pcVar12,&local_1a8);
          if (bVar5) {
            std::__cxx11::string::~string((string *)&local_1a8);
            goto LAB_001dabec;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sf,"COMPILE_OPTIONS",&local_23b);
          cVar11 = cmSourceFile::GetProperty(pcVar12,(string *)&sf);
          if (cVar11.Value == (string *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&unity_files,"COMPILE_DEFINITIONS",&local_23c);
            cVar11 = cmSourceFile::GetProperty(pcVar12,(string *)&unity_files);
            if (cVar11.Value == (string *)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"COMPILE_FLAGS",&local_23d);
              cVar11 = cmSourceFile::GetProperty(pcVar12,&local_70);
              if (cVar11.Value == (string *)0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,"INCLUDE_DIRECTORIES",&local_23e);
                cVar11 = cmSourceFile::GetProperty(pcVar12,&local_50);
                bVar5 = cVar11.Value == (string *)0x0;
                std::__cxx11::string::~string((string *)&local_50);
              }
              else {
                bVar5 = false;
              }
              std::__cxx11::string::~string((string *)&local_70);
            }
            else {
              bVar5 = false;
            }
            std::__cxx11::string::~string((string *)&unity_files);
          }
          else {
            bVar5 = false;
          }
          std::__cxx11::string::~string((string *)&sf);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&entry);
          std::__cxx11::string::~string((string *)&sources);
          if (bVar5) {
            std::
            vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
            ::push_back(&filtered_sources,__x);
          }
        }
        else {
LAB_001dabf4:
          std::__cxx11::string::~string((string *)&sources);
        }
      }
      unity_files.
      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unity_files.
      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unity_files.
      super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((__lhs.Value == (string *)0x0) || (bVar5 = std::operator==(__lhs.Value,"BATCH"), bVar5)) {
        AddUnityFilesModeAuto
                  ((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                    *)&sources,local_238,local_230,&lang,&configs,&filtered_sources,cVar10,
                   afterInclude,&filename_base,local_1e0);
LAB_001dadbc:
        std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
        _M_move_assign(&unity_files,(string *)&sources);
        std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
        ~vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                 *)&sources);
        cVar11.Value = &(unity_files.
                         super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Path;
        pUVar2 = unity_files.
                 super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        bVar5 = std::operator==(__lhs.Value,"GROUP");
        if (bVar5) {
          AddUnityFilesModeGroup
                    ((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                      *)&sources,local_238,local_230,&lang,&configs,&filtered_sources,cVar10,
                     afterInclude,&filename_base);
          goto LAB_001dadbc;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,
                       "Invalid UNITY_BUILD_MODE value of ",__lhs.Value);
        std::operator+(&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,
                       " assigned to target ");
        psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(local_230);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry,
                       &local_1a8,psVar9);
        std::operator+((string *)&sources,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry,
                       ". Acceptable values are BATCH and GROUP.");
        std::__cxx11::string::~string((string *)&entry);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&sf);
        IssueMessage(local_238,FATAL_ERROR,(string *)&sources);
        std::__cxx11::string::~string((string *)&sources);
        cVar11.Value = &(unity_files.
                         super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Path;
        pUVar2 = unity_files.
                 super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; (pointer)cVar11.Value != pUVar2;
          cVar11.Value = (string *)&cVar11.Value[1]._M_string_length) {
        pcVar12 = cmMakefile::GetOrCreateSource(local_238->Makefile,cVar11.Value,false,Ambiguous);
        cmGeneratorTarget::AddSource(local_230,cVar11.Value,true);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sources,"SKIP_UNITY_BUILD_INCLUSION",(allocator<char> *)&entry);
        cmSourceFile::SetProperty(pcVar12,(string *)&sources,"ON");
        std::__cxx11::string::~string((string *)&sources);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sources,"UNITY_SOURCE_FILE",(allocator<char> *)&entry);
        cmSourceFile::SetProperty(pcVar12,(string *)&sources,cVar11);
        std::__cxx11::string::~string((string *)&sources);
        if (*(char *)&cVar11.Value[1]._M_dataplus._M_p == '\x01') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&sources,"COMPILE_DEFINITIONS",(allocator<char> *)&entry);
          cmSourceFile::SetProperty
                    (pcVar12,(string *)&sources,"CMAKE_UNITY_CONFIG_$<UPPER_CASE:$<CONFIG>>");
          std::__cxx11::string::~string((string *)&sources);
        }
      }
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      ~vector(&unity_files);
      std::
      vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ::~vector(&filtered_sources);
      std::__cxx11::string::~string((string *)&lang);
    }
    std::__cxx11::string::~string((string *)&filename_base);
    std::
    _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
    ::~_Rb_tree(&index._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
    std::
    vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ::~vector(&unitySources);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddUnityBuild(cmGeneratorTarget* target)
{
  if (!target->GetPropertyAsBool("UNITY_BUILD")) {
    return;
  }

  std::vector<UnityBatchedSource> unitySources;

  std::vector<std::string> configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  std::map<cmSourceFile const*, size_t> index;

  for (size_t ci = 0; ci < configs.size(); ++ci) {
    // FIXME: Refactor collection of sources to not evaluate object libraries.
    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, configs[ci]);
    for (cmSourceFile* sf : sources) {
      auto mi = index.find(sf);
      if (mi == index.end()) {
        unitySources.emplace_back(sf);
        std::map<cmSourceFile const*, size_t>::value_type entry(
          sf, unitySources.size() - 1);
        mi = index.insert(entry).first;
      }
      unitySources[mi->second].Configs.emplace_back(ci);
    }
  }

  std::string filename_base =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/",
             target->GetName(), ".dir/Unity/");

  cmValue batchSizeString = target->GetProperty("UNITY_BUILD_BATCH_SIZE");
  const size_t unityBatchSize = batchSizeString
    ? static_cast<size_t>(std::atoi(batchSizeString->c_str()))
    : 0;

  cmValue beforeInclude =
    target->GetProperty("UNITY_BUILD_CODE_BEFORE_INCLUDE");
  cmValue afterInclude = target->GetProperty("UNITY_BUILD_CODE_AFTER_INCLUDE");
  cmValue unityMode = target->GetProperty("UNITY_BUILD_MODE");

  for (std::string lang : { "C", "CXX" }) {
    std::vector<UnityBatchedSource> filtered_sources;
    std::copy_if(unitySources.begin(), unitySources.end(),
                 std::back_inserter(filtered_sources),
                 [&](UnityBatchedSource const& ubs) -> bool {
                   cmSourceFile* sf = ubs.Source;
                   return sf->GetLanguage() == lang &&
                     !sf->GetPropertyAsBool("SKIP_UNITY_BUILD_INCLUSION") &&
                     !sf->GetPropertyAsBool("HEADER_FILE_ONLY") &&
                     !sf->GetProperty("COMPILE_OPTIONS") &&
                     !sf->GetProperty("COMPILE_DEFINITIONS") &&
                     !sf->GetProperty("COMPILE_FLAGS") &&
                     !sf->GetProperty("INCLUDE_DIRECTORIES");
                 });

    std::vector<UnitySource> unity_files;
    if (!unityMode || *unityMode == "BATCH") {
      unity_files = AddUnityFilesModeAuto(
        target, lang, configs, filtered_sources, beforeInclude, afterInclude,
        filename_base, unityBatchSize);
    } else if (unityMode && *unityMode == "GROUP") {
      unity_files =
        AddUnityFilesModeGroup(target, lang, configs, filtered_sources,
                               beforeInclude, afterInclude, filename_base);
    } else {
      // unity mode is set to an unsupported value
      std::string e("Invalid UNITY_BUILD_MODE value of " + *unityMode +
                    " assigned to target " + target->GetName() +
                    ". Acceptable values are BATCH and GROUP.");
      this->IssueMessage(MessageType::FATAL_ERROR, e);
    }

    for (UnitySource const& file : unity_files) {
      auto* unity = this->GetMakefile()->GetOrCreateSource(file.Path);
      target->AddSource(file.Path, true);
      unity->SetProperty("SKIP_UNITY_BUILD_INCLUSION", "ON");
      unity->SetProperty("UNITY_SOURCE_FILE", file.Path);
      if (file.PerConfig) {
        unity->SetProperty("COMPILE_DEFINITIONS",
                           "CMAKE_UNITY_CONFIG_$<UPPER_CASE:$<CONFIG>>");
      }
    }
  }
}